

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::makeKeySignature(MidiMessage *this,int fifths,bool mode)

{
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,5);
  *(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
   ._M_start = 0xff;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 'Y';
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = '\x02';
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = (uchar)fifths;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start[4] = mode;
  return;
}

Assistant:

void MidiMessage::makeKeySignature(int fifths, bool mode) {
    resize(5);
    (*this)[0] = 0xff;
    (*this)[1] = 0x59;
    (*this)[2] = 0x02;
    (*this)[3] = 0xff & fifths;
    (*this)[4] = 0xff & (int)mode;
}